

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunk_iterator.hpp
# Opt level: O0

void __thiscall
burst::buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
::increment(buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
            *this)

{
  istream_iterator<int,_char,_std::char_traits<char>,_long> *last;
  element_type *n;
  int *in_R9;
  tuple<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_&,_const_std::_Swallow_assign_&,_int_*&>
  local_68;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_50;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_40;
  tuple<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long,_int_*> local_30;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  *local_10;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  *this_local;
  
  local_10 = this;
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_40,&this->m_current);
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_50,&this->m_end);
  last = (istream_iterator<int,_char,_std::char_traits<char>,_long> *)this->m_chunk_size;
  n = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get
                (&(this->m_chunk).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>);
  copy_at_most_n<std::istream_iterator<int,char,std::char_traits<char>,long>,long,int*>
            (&local_30,(burst *)&local_40,&local_50,last,(long)n,in_R9);
  std::
  tie<std::istream_iterator<int,char,std::char_traits<char>,long>,std::_Swallow_assign_const,int*>
            (&local_68,&this->m_current,(_Swallow_assign *)&std::ignore,&this->m_chunk_end);
  std::
  tuple<std::istream_iterator<int,char,std::char_traits<char>,long>&,std::_Swallow_assign_const&,int*&>
  ::operator=((tuple<std::istream_iterator<int,char,std::char_traits<char>,long>&,std::_Swallow_assign_const&,int*&>
               *)&local_68,&local_30);
  return;
}

Assistant:

void increment ()
        {
            std::tie(m_current, std::ignore, m_chunk_end) =
                copy_at_most_n(m_current, m_end, m_chunk_size, m_chunk.get());
        }